

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VCompare_Serial(sunrealtype c,N_Vector x,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  sunrealtype *zd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  N_Vector x_local;
  sunrealtype c_local;
  
  lVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 0x10);
  lVar3 = *(long *)((long)z->content + 0x10);
  for (i = 0; i < lVar1; i = i + 1) {
    *(ulong *)(lVar3 + i * 8) = -(ulong)(c <= ABS(*(double *)(lVar2 + i * 8))) & 0x3ff0000000000000;
  }
  return;
}

Assistant:

void N_VCompare_Serial(sunrealtype c, N_Vector x, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *zd;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = (SUNRabs(xd[i]) >= c) ? ONE : ZERO; }

  return;
}